

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O1

void __thiscall
IRTreeBuildVisitor::IRTreeBuildVisitor(IRTreeBuildVisitor *this,NewScopeLayerTree *tree)

{
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).super_Visitor._vptr_Visitor =
       (_func_int **)&PTR_Visit_0016e600;
  (this->current_classname_)._M_dataplus._M_p = (pointer)&(this->current_classname_).field_2;
  (this->current_classname_)._M_string_length = 0;
  (this->current_classname_).field_2._M_local_buf[0] = '\0';
  this->tree_ = tree;
  (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&this->offsets_,0);
  (this->frame_translator_)._M_h._M_buckets = &(this->frame_translator_)._M_h._M_single_bucket;
  (this->frame_translator_)._M_h._M_bucket_count = 1;
  (this->frame_translator_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->frame_translator_)._M_h._M_element_count = 0;
  (this->frame_translator_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->frame_translator_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->frame_translator_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->method_trees_)._M_h._M_buckets = &(this->method_trees_)._M_h._M_single_bucket;
  (this->method_trees_)._M_h._M_bucket_count = 1;
  (this->method_trees_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->method_trees_)._M_h._M_element_count = 0;
  (this->method_trees_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->method_trees_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->method_trees_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  NewScopeLayer::PrepareTraversing(this->tree_->root_);
  this->current_layer_ = this->tree_->root_;
  this->current_frame_ = (FrameTranslator *)0x0;
  return;
}

Assistant:

IRTreeBuildVisitor::IRTreeBuildVisitor(NewScopeLayerTree* tree) : tree_(tree) {
  tree_->root_->PrepareTraversing();
  current_layer_ = tree_->root_;
  current_frame_ = nullptr;
}